

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

piece_data * __thiscall piece_data::operator=(piece_data *this,piece_data *pd)

{
  const_iterator __first;
  const_iterator __last;
  iterator __result;
  const_iterator __first_00;
  const_iterator __last_00;
  iterator __result_00;
  const_iterator __first_01;
  const_iterator __last_01;
  iterator __result_01;
  const_iterator __first_02;
  const_iterator __last_02;
  iterator __result_02;
  const_iterator __first_03;
  const_iterator __last_03;
  iterator __result_03;
  const_iterator __first_04;
  const_iterator __last_04;
  iterator __result_04;
  const_iterator __first_05;
  const_iterator __last_05;
  iterator __result_05;
  const_iterator __first_06;
  const_iterator __last_06;
  iterator __result_06;
  piece_data *pd_local;
  piece_data *this_local;
  
  __first = std::begin<std::array<unsigned_long,2ul>>(&pd->bycolor);
  __last = std::end<std::array<unsigned_long,2ul>>(&pd->bycolor);
  __result = std::begin<std::array<unsigned_long,2ul>>(&this->bycolor);
  std::copy<unsigned_long_const*,unsigned_long*>(__first,__last,__result);
  __first_00 = std::begin<std::array<Square,2ul>>(&pd->king_sq);
  __last_00 = std::end<std::array<Square,2ul>>(&pd->king_sq);
  __result_00 = std::begin<std::array<Square,2ul>>(&this->king_sq);
  std::copy<Square_const*,Square*>(__first_00,__last_00,__result_00);
  __first_01 = std::begin<std::array<Color,64ul>>(&pd->color_on);
  __last_01 = std::end<std::array<Color,64ul>>(&pd->color_on);
  __result_01 = std::begin<std::array<Color,64ul>>(&this->color_on);
  std::copy<Color_const*,Color*>(__first_01,__last_01,__result_01);
  __first_02 = std::begin<std::array<Piece,64ul>>(&pd->piece_on);
  __last_02 = std::end<std::array<Piece,64ul>>(&pd->piece_on);
  __result_02 = std::begin<std::array<Piece,64ul>>(&this->piece_on);
  std::copy<Piece_const*,Piece*>(__first_02,__last_02,__result_02);
  __first_03 = std::begin<std::array<std::array<int,6ul>,2ul>>(&pd->number_of);
  __last_03 = std::end<std::array<std::array<int,6ul>,2ul>>(&pd->number_of);
  __result_03 = std::begin<std::array<std::array<int,6ul>,2ul>>(&this->number_of);
  std::copy<std::array<int,6ul>const*,std::array<int,6ul>*>(__first_03,__last_03,__result_03);
  __first_04 = std::begin<std::array<std::array<unsigned_long,64ul>,2ul>>(&pd->bitmap);
  __last_04 = std::end<std::array<std::array<unsigned_long,64ul>,2ul>>(&pd->bitmap);
  __result_04 = std::begin<std::array<std::array<unsigned_long,64ul>,2ul>>(&this->bitmap);
  std::copy<std::array<unsigned_long,64ul>const*,std::array<unsigned_long,64ul>*>
            (__first_04,__last_04,__result_04);
  __first_05 = std::begin<std::array<std::array<std::array<int,64ul>,6ul>,2ul>>(&pd->piece_idx);
  __last_05 = std::end<std::array<std::array<std::array<int,64ul>,6ul>,2ul>>(&pd->piece_idx);
  __result_05 = std::begin<std::array<std::array<std::array<int,64ul>,6ul>,2ul>>(&this->piece_idx);
  std::copy<std::array<std::array<int,64ul>,6ul>const*,std::array<std::array<int,64ul>,6ul>*>
            (__first_05,__last_05,__result_05);
  __first_06 = std::begin<std::array<std::array<std::array<Square,11ul>,6ul>,2ul>>(&pd->square_of);
  __last_06 = std::end<std::array<std::array<std::array<Square,11ul>,6ul>,2ul>>(&pd->square_of);
  __result_06 = std::begin<std::array<std::array<std::array<Square,11ul>,6ul>,2ul>>
                          (&this->square_of);
  std::copy<std::array<std::array<Square,11ul>,6ul>const*,std::array<std::array<Square,11ul>,6ul>*>
            (__first_06,__last_06,__result_06);
  return this;
}

Assistant:

piece_data& piece_data::operator=(const piece_data& pd) {
	std::copy(std::begin(pd.bycolor), std::end(pd.bycolor), std::begin(bycolor));
	std::copy(std::begin(pd.king_sq), std::end(pd.king_sq), std::begin(king_sq));
	std::copy(std::begin(pd.color_on), std::end(pd.color_on), std::begin(color_on));
	std::copy(std::begin(pd.piece_on), std::end(pd.piece_on), std::begin(piece_on));
	std::copy(std::begin(pd.number_of), std::end(pd.number_of), std::begin(number_of));
	std::copy(std::begin(pd.bitmap), std::end(pd.bitmap), std::begin(bitmap));
	std::copy(std::begin(pd.piece_idx), std::end(pd.piece_idx), std::begin(piece_idx));
	std::copy(std::begin(pd.square_of), std::end(pd.square_of), std::begin(square_of));
	return (*this);
}